

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

void amrex::MultiFab::Xpay
               (MultiFab *dst,Real a,MultiFab *src,int srccomp,int dstcomp,int numcomp,
               IntVect *nghost)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Array4<double> dfab;
  Array4<const_double> sfab;
  MFIter mfi;
  Box local_180;
  int local_164;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  IntVect *local_140;
  FabArray<amrex::FArrayBox> *local_138;
  Real local_130;
  FabArray<amrex::FArrayBox> *local_128;
  ulong local_120;
  ulong local_118;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_138 = &dst->super_FabArray<amrex::FArrayBox>;
  local_130 = a;
  local_128 = &src->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)dst,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_120 = (ulong)(uint)numcomp;
    local_148 = (long)srccomp << 3;
    local_150 = (long)dstcomp << 3;
    local_140 = nghost;
    do {
      MFIter::growntilebox(&local_180,&local_90,nghost);
      if ((((local_180.smallend.vect[0] <= local_180.bigend.vect[0]) &&
           (local_180.smallend.vect[1] <= local_180.bigend.vect[1])) &&
          (local_180.smallend.vect[2] <= local_180.bigend.vect[2])) && (local_180.btype.itype < 8))
      {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,local_128,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,local_138,&local_90);
        nghost = local_140;
        if (0 < numcomp) {
          local_164 = local_180.smallend.vect[2];
          lVar3 = (long)local_180.smallend.vect[1];
          local_158 = local_150;
          local_160 = local_148;
          uVar1 = 0;
          do {
            local_118 = uVar1;
            iVar2 = local_180.smallend.vect[2];
            if (local_180.smallend.vect[2] <= local_180.bigend.vect[2]) {
              do {
                if (local_180.smallend.vect[1] <= local_180.bigend.vect[1]) {
                  lVar6 = (long)local_d0.p +
                          local_d0.nstride * local_160 +
                          (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
                          ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)local_180.smallend.vect[0] * 8;
                  lVar5 = (long)local_110.p +
                          local_110.nstride * local_158 +
                          (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                          ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride * 8 +
                          (long)local_110.begin.x * -8 + (long)local_180.smallend.vect[0] * 8;
                  lVar4 = lVar3;
                  do {
                    if (local_180.smallend.vect[0] <= local_180.bigend.vect[0]) {
                      lVar7 = 0;
                      do {
                        *(double *)(lVar5 + lVar7 * 8) =
                             *(double *)(lVar5 + lVar7 * 8) * local_130 +
                             *(double *)(lVar6 + lVar7 * 8);
                        lVar7 = lVar7 + 1;
                      } while ((local_180.bigend.vect[0] - local_180.smallend.vect[0]) + 1 !=
                               (int)lVar7);
                    }
                    lVar4 = lVar4 + 1;
                    lVar6 = lVar6 + local_d0.jstride * 8;
                    lVar5 = lVar5 + local_110.jstride * 8;
                  } while (local_180.bigend.vect[1] + 1 != (int)lVar4);
                }
                bVar8 = iVar2 != local_180.bigend.vect[2];
                iVar2 = iVar2 + 1;
              } while (bVar8);
            }
            local_160 = local_160 + 8;
            local_158 = local_158 + 8;
            uVar1 = local_118 + 1;
          } while (local_118 + 1 != local_120);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MultiFab::Xpay (MultiFab& dst, Real a, const MultiFab& src,
                int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == src.boxArray());
    BL_ASSERT(dst.distributionMap == src.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && src.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::Xpay()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& srcma = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,n+dstcomp) = srcma[box_no](i,j,k,n+srccomp)
                +                        a * dstma[box_no](i,j,k,n+dstcomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok()) {
                auto const sfab = src.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,n+dstcomp) = sfab(i,j,k,n+srccomp) + a * dfab(i,j,k,n+dstcomp);
                });
            }
        }
    }
}